

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O3

bool slang::ast::builtins::isComparable(Type *type)

{
  bool bVar1;
  Type *pTVar2;
  bool bVar3;
  
  bVar1 = Type::isNumeric(type);
  bVar3 = true;
  if (!bVar1) {
    pTVar2 = type->canonical;
    if (pTVar2 == (Type *)0x0) {
      Type::resolveCanonical(type);
      pTVar2 = type->canonical;
    }
    bVar3 = (pTVar2->super_Symbol).kind == StringType;
  }
  return bVar3;
}

Assistant:

static bool isComparable(const Type& type) {
    return type.isNumeric() || type.isString();
}